

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void print_usage(char *command,char *default_flags)

{
  size_t sVar1;
  ulong local_20;
  size_t i;
  char *default_flags_local;
  char *command_local;
  
  printf("Usage %s <rom_file> [flags [seed [sprite]]] <output_dir>\n",command);
  printf("\n");
  printf("A randomizer for Dragon Warrior for NES\n");
  printf("\n");
  printf("\n");
  printf("If flags are not specified, the flags \"%s\" will be used\n",default_flags);
  printf("If the seed is not specified, a random seed will be chosen\n");
  printf("\n");
  printf("Sprite should be one of: ");
  local_20 = 0;
  while( true ) {
    sVar1 = sprite_count();
    if (sVar1 <= local_20) break;
    if (local_20 == 0) {
      printf("%s","Random");
    }
    else {
      printf(", %s",dwr_sprite_names[local_20]);
    }
    local_20 = local_20 + 1;
  }
  printf("\n");
  return;
}

Assistant:

static void print_usage(const char *command, char *default_flags)
{
    size_t i;

    printf("Usage %s <rom_file> [flags [seed [sprite]]] <output_dir>\n", command);
    printf("\n");
    printf("A randomizer for Dragon Warrior for NES\n");
    printf("\n");
    printf("\n");
    printf("If flags are not specified, the flags \"%s\" will be used\n",
            default_flags);
    printf("If the seed is not specified, a random seed will be chosen\n");
    printf("\n");
    printf("Sprite should be one of: ");
    for(i=0; i < sprite_count(); i++) {
        if (i) {
            printf(", %s", dwr_sprite_names[i]);
        } else {
            printf("%s", dwr_sprite_names[i]);
        }
    }
    printf("\n");
}